

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.c
# Opt level: O3

int quicly_decode_ack_frame(uint8_t **src,uint8_t *end,quicly_ack_frame_t *frame,int is_ack_ecn)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  
  uVar1 = ptls_decode_quicint(src,end);
  frame->largest_acknowledged = uVar1;
  iVar5 = 0x20007;
  if (uVar1 != 0xffffffffffffffff) {
    uVar1 = ptls_decode_quicint(src,end);
    frame->ack_delay = uVar1;
    if ((((uVar1 != 0xffffffffffffffff) &&
         (uVar1 = ptls_decode_quicint(src,end), uVar1 != 0xffffffffffffffff)) &&
        (uVar2 = ptls_decode_quicint(src,end), uVar2 != 0xffffffffffffffff)) &&
       (uVar2 <= frame->largest_acknowledged)) {
      frame->smallest_acknowledged = frame->largest_acknowledged - uVar2;
      frame->ack_block_lengths[0] = uVar2 + 1;
      frame->num_gaps = 0;
      if (uVar1 != 0) {
        uVar6 = 0;
        do {
          uVar2 = ptls_decode_quicint(src,end);
          if (uVar2 == 0xffffffffffffffff) {
            return 0x20007;
          }
          uVar3 = ptls_decode_quicint(src,end);
          if (uVar3 == 0xffffffffffffffff) {
            return 0x20007;
          }
          if (uVar6 < 0x100) {
            uVar4 = uVar3 + uVar2 + 2;
            if (frame->smallest_acknowledged < uVar4) {
              return 0x20007;
            }
            frame->gaps[uVar6] = uVar2 + 1;
            frame->ack_block_lengths[uVar6 + 1] = uVar3 + 1;
            frame->smallest_acknowledged = frame->smallest_acknowledged - uVar4;
            frame->num_gaps = frame->num_gaps + 1;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar1);
      }
      if (is_ack_ecn != 0) {
        lVar7 = 3;
        do {
          uVar1 = ptls_decode_quicint(src,end);
          if (uVar1 == 0xffffffffffffffff) {
            return 0x20007;
          }
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int quicly_decode_ack_frame(const uint8_t **src, const uint8_t *end, quicly_ack_frame_t *frame, int is_ack_ecn)
{
    uint64_t i, num_gaps, gap, ack_range;

    if ((frame->largest_acknowledged = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;
    if ((frame->ack_delay = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;
    if ((num_gaps = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;

    if ((ack_range = quicly_decodev(src, end)) == UINT64_MAX)
        goto Error;
    if (frame->largest_acknowledged < ack_range)
        goto Error;
    frame->smallest_acknowledged = frame->largest_acknowledged - ack_range;
    frame->ack_block_lengths[0] = ack_range + 1;
    frame->num_gaps = 0;

    for (i = 0; i != num_gaps; ++i) {
        if ((gap = quicly_decodev(src, end)) == UINT64_MAX)
            goto Error;
        if ((ack_range = quicly_decodev(src, end)) == UINT64_MAX)
            goto Error;
        if (i < QUICLY_ACK_MAX_GAPS) {
            if (frame->smallest_acknowledged < gap + ack_range + 2)
                goto Error;
            frame->gaps[i] = gap + 1;
            frame->ack_block_lengths[i + 1] = ack_range + 1;
            frame->smallest_acknowledged -= gap + ack_range + 2;
            ++frame->num_gaps;
        }
    }

    if (is_ack_ecn) {
        /* just skip ECT(0), ECT(1), ECT-CE counters for the time being */
        for (i = 0; i != 3; ++i)
            if (quicly_decodev(src, end) == UINT64_MAX)
                goto Error;
    }
    return 0;
Error:
    return QUICLY_TRANSPORT_ERROR_FRAME_ENCODING;
}